

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

bool __thiscall
wasm::OptimizeInstructions::shouldCanonicalize(OptimizeInstructions *this,Binary *binary)

{
  BinaryOp BVar1;
  bool bVar2;
  Const *pCVar3;
  Const *c;
  Binary *binary_local;
  OptimizeInstructions *this_local;
  
  if ((((binary->op == SubInt32) || (binary->op == SubInt64)) &&
      (bVar2 = Expression::is<wasm::Const>(binary->right), bVar2)) &&
     (bVar2 = Expression::is<wasm::Const>(binary->left), !bVar2)) {
    return true;
  }
  bVar2 = Properties::isSymmetric(binary);
  if ((bVar2) || (bVar2 = Binary::isRelational(binary), bVar2)) {
    return true;
  }
  BVar1 = binary->op;
  if (BVar1 != AddFloat32) {
    if (BVar1 == SubFloat32) {
LAB_01f829a9:
      bVar2 = Expression::is<wasm::Const>(binary->right);
      return bVar2;
    }
    if ((BVar1 != MulFloat32) && (BVar1 != AddFloat64)) {
      if (BVar1 == SubFloat64) goto LAB_01f829a9;
      if (BVar1 != MulFloat64) {
        return false;
      }
    }
  }
  pCVar3 = Expression::dynCast<wasm::Const>(binary->left);
  if (pCVar3 == (Const *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = wasm::Literal::isNaN(&pCVar3->value);
    this_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool shouldCanonicalize(Binary* binary) {
    if ((binary->op == SubInt32 || binary->op == SubInt64) &&
        binary->right->is<Const>() && !binary->left->is<Const>()) {
      return true;
    }
    if (Properties::isSymmetric(binary) || binary->isRelational()) {
      return true;
    }
    switch (binary->op) {
      case SubFloat32:
      case SubFloat64: {
        // Should apply  x - C  ->  x + (-C)
        return binary->right->is<Const>();
      }
      case AddFloat32:
      case MulFloat32:
      case AddFloat64:
      case MulFloat64: {
        // If the LHS is known to be non-NaN, the operands can commute.
        // We don't care about the RHS because right now we only know if
        // an expression is non-NaN if it is constant, but if the RHS is
        // constant, then this expression is already canonicalized.
        if (auto* c = binary->left->dynCast<Const>()) {
          return !c->value.isNaN();
        }
        return false;
      }
      default:
        return false;
    }
  }